

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void __thiscall Assimp::glTF2Importer::ImportAnimations(glTF2Importer *this,Asset *r)

{
  _Hash_node_base *p_Var1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  aiAnimation **ppaVar6;
  Animation *anim_00;
  aiAnimation *this_00;
  _Hash_node_base *p_Var7;
  reference ppVar8;
  aiNodeAnim *paVar9;
  Node *pNVar10;
  aiMeshMorphAnim *paVar11;
  uint *puVar12;
  aiMeshMorphKey *lastKey;
  aiMeshMorphAnim *chan_1;
  uint j_3;
  aiVectorKey lastScaleKey;
  aiQuatKey lastRotKey;
  aiVectorKey lastPosKey;
  aiNodeAnim *chan;
  uint j_2;
  uint maxNumberOfKeys;
  double maxDuration;
  pair<const_unsigned_int,_AnimationSamplers> *iter_2;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  *__range3_1;
  int j_1;
  pair<const_unsigned_int,_AnimationSamplers> *iter_1;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  *__range3;
  int j;
  pair<const_unsigned_int,_AnimationSamplers> *iter;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  *__range2;
  uint32_t numMorphMeshChannels;
  uint32_t numChannels;
  unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
  samplers;
  aiAnimation *ai_anim;
  Animation *anim;
  uint i;
  Asset *r_local;
  glTF2Importer *this_local;
  
  bVar3 = glTF2::Ref::operator_cast_to_bool((Ref *)&r->scene);
  if (bVar3) {
    uVar4 = glTF2::LazyDict<glTF2::Animation>::Size(&r->animations);
    this->mScene->mNumAnimations = uVar4;
    if (this->mScene->mNumAnimations != 0) {
      auVar2 = ZEXT416(this->mScene->mNumAnimations) * ZEXT816(8);
      uVar5 = auVar2._0_8_;
      if (auVar2._8_8_ != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      ppaVar6 = (aiAnimation **)operator_new__(uVar5);
      this->mScene->mAnimations = ppaVar6;
      for (anim._4_4_ = 0; uVar4 = glTF2::LazyDict<glTF2::Animation>::Size(&r->animations),
          anim._4_4_ < uVar4; anim._4_4_ = anim._4_4_ + 1) {
        anim_00 = glTF2::LazyDict<glTF2::Animation>::operator[](&r->animations,(ulong)anim._4_4_);
        this_00 = (aiAnimation *)operator_new(0x448);
        aiAnimation::aiAnimation(this_00);
        samplers._M_h._M_single_bucket = (__node_base_ptr)this_00;
        aiString::operator=((aiString *)this_00,&(anim_00->super_Object).name);
        samplers._M_h._M_single_bucket[0x81]._M_nxt = (_Hash_node_base *)0x0;
        samplers._M_h._M_single_bucket[0x82]._M_nxt = (_Hash_node_base *)0x0;
        GatherSamplers((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                        *)&numMorphMeshChannels,anim_00);
        __range2._4_4_ = 0;
        __range2._0_4_ = 0;
        __end2 = std::
                 unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                 ::begin((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&numMorphMeshChannels);
        iter = (pair<const_unsigned_int,_AnimationSamplers> *)
               std::
               unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
               ::end((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                      *)&numMorphMeshChannels);
        while (bVar3 = std::__detail::operator!=
                                 (&__end2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                  ,(_Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                    *)&iter), bVar3) {
          ppVar8 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>::
                   operator*(&__end2);
          if ((((ppVar8->second).rotation != (Sampler *)0x0) ||
              ((ppVar8->second).scale != (Sampler *)0x0)) ||
             ((ppVar8->second).translation != (Sampler *)0x0)) {
            __range2._4_4_ = __range2._4_4_ + 1;
          }
          if ((ppVar8->second).weight != (Sampler *)0x0) {
            __range2._0_4_ = (int)__range2 + 1;
          }
          std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>::operator++
                    (&__end2);
        }
        *(int *)&samplers._M_h._M_single_bucket[0x83]._M_nxt = __range2._4_4_;
        if (*(int *)&samplers._M_h._M_single_bucket[0x83]._M_nxt != 0) {
          p_Var7 = (_Hash_node_base *)
                   operator_new__((ulong)*(uint *)&samplers._M_h._M_single_bucket[0x83]._M_nxt << 3)
          ;
          samplers._M_h._M_single_bucket[0x84]._M_nxt = p_Var7;
          __range3._0_4_ = 0;
          __end3 = std::
                   unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                   ::begin((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                            *)&numMorphMeshChannels);
          iter_1 = (pair<const_unsigned_int,_AnimationSamplers> *)
                   std::
                   unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                   ::end((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&numMorphMeshChannels);
          while (bVar3 = std::__detail::operator!=
                                   (&__end3.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                    ,(_Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                      *)&iter_1), bVar3) {
            ppVar8 = std::__detail::
                     _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>
                     ::operator*(&__end3);
            if ((((ppVar8->second).rotation != (Sampler *)0x0) ||
                ((ppVar8->second).scale != (Sampler *)0x0)) ||
               ((ppVar8->second).translation != (Sampler *)0x0)) {
              pNVar10 = glTF2::LazyDict<glTF2::Node>::operator[](&r->nodes,(ulong)ppVar8->first);
              paVar9 = CreateNodeAnim(r,pNVar10,&ppVar8->second);
              samplers._M_h._M_single_bucket[0x84]._M_nxt[(int)__range3]._M_nxt =
                   (_Hash_node_base *)paVar9;
              __range3._0_4_ = (int)__range3 + 1;
            }
            std::__detail::
            _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>::
            operator++(&__end3);
          }
        }
        *(int *)&samplers._M_h._M_single_bucket[0x87]._M_nxt = (int)__range2;
        if (*(int *)&samplers._M_h._M_single_bucket[0x87]._M_nxt != 0) {
          p_Var7 = (_Hash_node_base *)
                   operator_new__((ulong)*(uint *)&samplers._M_h._M_single_bucket[0x87]._M_nxt << 3)
          ;
          samplers._M_h._M_single_bucket[0x88]._M_nxt = p_Var7;
          __range3_1._4_4_ = 0;
          __end3_1 = std::
                     unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                     ::begin((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                              *)&numMorphMeshChannels);
          iter_2 = (pair<const_unsigned_int,_AnimationSamplers> *)
                   std::
                   unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                   ::end((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&numMorphMeshChannels);
          while (bVar3 = std::__detail::operator!=
                                   (&__end3_1.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                    ,(_Node_iterator_base<std::pair<const_unsigned_int,_AnimationSamplers>,_false>
                                      *)&iter_2), bVar3) {
            maxDuration = (double)std::__detail::
                                  _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>
                                  ::operator*(&__end3_1);
            if ((((reference)maxDuration)->second).weight != (Sampler *)0x0) {
              pNVar10 = glTF2::LazyDict<glTF2::Node>::operator[]
                                  (&r->nodes,(ulong)((reference)maxDuration)->first);
              paVar11 = CreateMeshMorphAnim(r,pNVar10,(AnimationSamplers *)((long)maxDuration + 8));
              samplers._M_h._M_single_bucket[0x88]._M_nxt[__range3_1._4_4_]._M_nxt =
                   (_Hash_node_base *)paVar11;
              __range3_1._4_4_ = __range3_1._4_4_ + 1;
            }
            std::__detail::
            _Node_iterator<std::pair<const_unsigned_int,_AnimationSamplers>,_false,_false>::
            operator++(&__end3_1);
          }
        }
        _j_2 = (_Hash_node_base *)0x0;
        chan._4_4_ = 0;
        for (chan._0_4_ = 0; (uint)chan < *(uint *)&samplers._M_h._M_single_bucket[0x83]._M_nxt;
            chan._0_4_ = (uint)chan + 1) {
          p_Var7 = samplers._M_h._M_single_bucket[0x84]._M_nxt[(uint)chan]._M_nxt;
          if (*(int *)((long)&p_Var7[0x80]._M_nxt + 4) != 0) {
            p_Var1 = p_Var7[0x81]._M_nxt[(ulong)(*(int *)((long)&p_Var7[0x80]._M_nxt + 4) - 1) * 3].
                     _M_nxt;
            if ((double)_j_2 < (double)p_Var1) {
              _j_2 = p_Var1;
            }
            puVar12 = std::max<unsigned_int>
                                ((uint *)((long)&chan + 4),(uint *)((long)&p_Var7[0x80]._M_nxt + 4))
            ;
            chan._4_4_ = *puVar12;
          }
          if (*(int *)&p_Var7[0x82]._M_nxt != 0) {
            p_Var1 = p_Var7[0x83]._M_nxt[(ulong)(*(int *)&p_Var7[0x82]._M_nxt - 1) * 3]._M_nxt;
            if ((double)_j_2 < (double)p_Var1) {
              _j_2 = p_Var1;
            }
            puVar12 = std::max<unsigned_int>((uint *)((long)&chan + 4),(uint *)(p_Var7 + 0x82));
            chan._4_4_ = *puVar12;
          }
          if (*(int *)&p_Var7[0x84]._M_nxt != 0) {
            p_Var1 = p_Var7[0x85]._M_nxt[(ulong)(*(int *)&p_Var7[0x84]._M_nxt - 1) * 3]._M_nxt;
            if ((double)_j_2 < (double)p_Var1) {
              _j_2 = p_Var1;
            }
            puVar12 = std::max<unsigned_int>((uint *)((long)&chan + 4),(uint *)(p_Var7 + 0x84));
            chan._4_4_ = *puVar12;
          }
        }
        for (chan_1._4_4_ = 0; chan_1._4_4_ < *(uint *)&samplers._M_h._M_single_bucket[0x87]._M_nxt;
            chan_1._4_4_ = chan_1._4_4_ + 1) {
          p_Var7 = samplers._M_h._M_single_bucket[0x88]._M_nxt[chan_1._4_4_]._M_nxt;
          if (*(int *)((long)&p_Var7[0x80]._M_nxt + 4) != 0) {
            if ((double)_j_2 <
                (double)p_Var7[0x81]._M_nxt
                        [(ulong)(*(int *)((long)&p_Var7[0x80]._M_nxt + 4) - 1) * 4]._M_nxt) {
              _j_2 = p_Var7[0x81]._M_nxt[(ulong)(*(int *)((long)&p_Var7[0x80]._M_nxt + 4) - 1) * 4].
                     _M_nxt;
            }
            puVar12 = std::max<unsigned_int>
                                ((uint *)((long)&chan + 4),(uint *)((long)&p_Var7[0x80]._M_nxt + 4))
            ;
            chan._4_4_ = *puVar12;
          }
        }
        samplers._M_h._M_single_bucket[0x81]._M_nxt = _j_2;
        samplers._M_h._M_single_bucket[0x82]._M_nxt = (_Hash_node_base *)0x408f400000000000;
        this->mScene->mAnimations[anim._4_4_] = (aiAnimation *)samplers._M_h._M_single_bucket;
        std::
        unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_AnimationSamplers,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_AnimationSamplers>_>_>
                          *)&numMorphMeshChannels);
      }
    }
  }
  return;
}

Assistant:

void glTF2Importer::ImportAnimations(glTF2::Asset& r)
{
    if (!r.scene) return;

    mScene->mNumAnimations = r.animations.Size();
    if (mScene->mNumAnimations == 0) {
        return;
    }

    mScene->mAnimations = new aiAnimation*[mScene->mNumAnimations];
    for (unsigned int i = 0; i < r.animations.Size(); ++i) {
        Animation& anim = r.animations[i];

        aiAnimation* ai_anim = new aiAnimation();
        ai_anim->mName = anim.name;
        ai_anim->mDuration = 0;
        ai_anim->mTicksPerSecond = 0;

        std::unordered_map<unsigned int, AnimationSamplers> samplers = GatherSamplers(anim);

        uint32_t numChannels = 0u;
        uint32_t numMorphMeshChannels = 0u;

        for (auto& iter : samplers) {
            if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
                ++numChannels;
            }
            if (nullptr != iter.second.weight) {
                ++numMorphMeshChannels;
            }
        }

        ai_anim->mNumChannels = numChannels;
        if (ai_anim->mNumChannels > 0) {
            ai_anim->mChannels = new aiNodeAnim*[ai_anim->mNumChannels];
            int j = 0;
            for (auto& iter : samplers) {
                if ((nullptr != iter.second.rotation) || (nullptr != iter.second.scale) || (nullptr != iter.second.translation)) {
                    ai_anim->mChannels[j] = CreateNodeAnim(r, r.nodes[iter.first], iter.second);
                    ++j;
                }
            }
        }

        ai_anim->mNumMorphMeshChannels = numMorphMeshChannels;
        if (ai_anim->mNumMorphMeshChannels > 0) {
            ai_anim->mMorphMeshChannels = new aiMeshMorphAnim*[ai_anim->mNumMorphMeshChannels];
            int j = 0;
            for (auto& iter : samplers) {
                if (nullptr != iter.second.weight) {
                  ai_anim->mMorphMeshChannels[j] = CreateMeshMorphAnim(r, r.nodes[iter.first], iter.second);
                  ++j;
                }
            }
        }

        // Use the latest keyframe for the duration of the animation
        double maxDuration = 0;
        unsigned int maxNumberOfKeys = 0;
        for (unsigned int j = 0; j < ai_anim->mNumChannels; ++j) {
            auto chan = ai_anim->mChannels[j];
            if (chan->mNumPositionKeys) {
                auto lastPosKey = chan->mPositionKeys[chan->mNumPositionKeys - 1];
                if (lastPosKey.mTime > maxDuration) {
                    maxDuration = lastPosKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumPositionKeys);
            }
            if (chan->mNumRotationKeys) {
                auto lastRotKey = chan->mRotationKeys[chan->mNumRotationKeys - 1];
                if (lastRotKey.mTime > maxDuration) {
                    maxDuration = lastRotKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumRotationKeys);
            }
            if (chan->mNumScalingKeys) {
                auto lastScaleKey = chan->mScalingKeys[chan->mNumScalingKeys - 1];
                if (lastScaleKey.mTime > maxDuration) {
                    maxDuration = lastScaleKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumScalingKeys);
            }
        }

        for (unsigned int j = 0; j < ai_anim->mNumMorphMeshChannels; ++j) {
            const auto* const chan = ai_anim->mMorphMeshChannels[j];

            if (0u != chan->mNumKeys) {
                const auto& lastKey = chan->mKeys[chan->mNumKeys - 1u];
                if (lastKey.mTime > maxDuration) {
                    maxDuration = lastKey.mTime;
                }
                maxNumberOfKeys = std::max(maxNumberOfKeys, chan->mNumKeys);
            }
        }

        ai_anim->mDuration = maxDuration;
        ai_anim->mTicksPerSecond = 1000.0;

        mScene->mAnimations[i] = ai_anim;
    }
}